

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O2

void BrotliDestroyEncoderDictionary(MemoryManager *m,BrotliEncoderDictionary *dict)

{
  duckdb_brotli::BrotliFree(m,dict->hash_table_data_words_);
  duckdb_brotli::BrotliFree(m,dict->hash_table_data_lengths_);
  duckdb_brotli::BrotliFree(m,dict->buckets_data_);
  duckdb_brotli::BrotliFree(m,dict->dict_words_data_);
  duckdb_brotli::BrotliFree(m,dict->words_instance_);
  duckdb_brotli::BrotliFree(m,(dict->trie).pool);
  return;
}

Assistant:

static void BrotliDestroyEncoderDictionary(MemoryManager* m,
    BrotliEncoderDictionary* dict) {
  BrotliFree(m, dict->hash_table_data_words_);
  BrotliFree(m, dict->hash_table_data_lengths_);
  BrotliFree(m, dict->buckets_data_);
  BrotliFree(m, dict->dict_words_data_);
  BrotliFree(m, dict->words_instance_);
  BrotliTrieFree(m, &dict->trie);
}